

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_Material * __thiscall
ON_RenderMaterial::ToOnMaterial(ON_Material *__return_storage_ptr__,ON_RenderMaterial *this)

{
  double dVar1;
  bool bVar2;
  ON_XMLNode *node;
  element_type *peVar3;
  wchar_t *pwVar4;
  ON_4fColor OVar5;
  float local_29c8;
  float fStack_29c4;
  float local_29b8;
  float fStack_29b4;
  float local_2988;
  float fStack_2984;
  float local_2978;
  float fStack_2974;
  float local_28e8;
  float fStack_28e4;
  float local_2888;
  float fStack_2884;
  float local_2858;
  float fStack_2854;
  float local_2828;
  float fStack_2824;
  ON_wString local_27f8;
  ON_wString local_27f0;
  ON_Xform local_27e8;
  ON_wString local_2768;
  ON_wString local_2760;
  ON_wString local_2758;
  ON_wString local_2750;
  ON_wString local_2748;
  ON_wString local_2740;
  undefined1 local_2738 [24];
  ON_wString local_2720;
  ON_wString s_1;
  ON_XMLVariant v;
  ON_Texture tex;
  undefined1 local_2418 [4];
  int count;
  ON_XMLVariant local_2410;
  ON_XMLVariant local_2318;
  ON_XMLVariant local_2220;
  undefined8 local_2128;
  undefined8 local_2120;
  ON_XMLVariant local_2118;
  ON_XMLVariant local_2020;
  ON_XMLVariant local_1f28;
  ON_XMLVariant local_1e30;
  ON_XMLVariant local_1d38;
  ON_XMLVariant local_1c40;
  ON_XMLVariant local_1b48;
  ON_XMLVariant local_1a50;
  ON_XMLVariant local_1958;
  ON_XMLVariant local_1860;
  ON_XMLVariant local_1768;
  ON_XMLVariant local_1670;
  ON_XMLVariant local_1578;
  ON_XMLVariant local_1480;
  ON_XMLVariant local_1388;
  float local_1290;
  float fStack_128c;
  float local_1288;
  float fStack_1284;
  ON_XMLVariant local_1280;
  ON_XMLVariant local_1188;
  float local_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  ON_XMLVariant local_1080;
  undefined1 local_f88 [8];
  ON_wString s;
  undefined1 local_f78 [4];
  BRDFs brdf;
  shared_ptr<ON_PhysicallyBasedMaterial> pbm;
  ON_XMLVariant local_e70;
  ON_XMLVariant local_d78;
  ON_XMLVariant local_c80;
  ON_XMLVariant local_b88;
  ON_XMLVariant local_a90;
  ON_XMLVariant local_998;
  ON_4fColor local_89c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_88c;
  ON_XMLVariant local_888;
  ON_XMLVariant local_790;
  ON_XMLVariant local_698;
  ON_4fColor local_59c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_58c;
  ON_XMLVariant local_588;
  ON_XMLVariant local_490;
  ON_4fColor local_394;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_384;
  ON_XMLVariant local_380;
  ON_4fColor local_284;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_274;
  ON_XMLVariant local_270;
  ON_4fColor local_174;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_164;
  ON_XMLVariant local_160;
  ON_4fColor local_64;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_54;
  undefined1 local_50 [8];
  ON_XMLParameters p;
  ON_XMLNode *sim_node;
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> lg;
  ON_RenderMaterial *this_local;
  ON_Material *mat;
  
  lg._M_device = (mutex_type *)this;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (&local_20,&((this->super_ON_RenderContent)._private)->m_mutex);
  ON_Material::ON_Material(__return_storage_ptr__);
  node = ON_RenderContentPrivate::XMLNode_Simulation((this->super_ON_RenderContent)._private);
  if (node != (ON_XMLNode *)0x0) {
    ON_XMLParameters::ON_XMLParameters((ON_XMLParameters *)local_50,node);
    ParamHelper(&local_160,(ON_XMLParameters *)local_50,L"ambient");
    OVar5 = ::ON_XMLVariant::AsColor(&local_160);
    local_64.m_color._8_8_ = OVar5.m_color._8_8_;
    local_2828 = OVar5.m_color[0];
    fStack_2824 = OVar5.m_color[1];
    local_64.m_color[0] = local_2828;
    local_64.m_color[1] = fStack_2824;
    local_54 = (anon_union_4_2_6147a14e_for_ON_Color_15)
               ON_4fColor::operator_cast_to_ON_Color(&local_64);
    (__return_storage_ptr__->m_ambient).field_0 = local_54;
    ::ON_XMLVariant::~ON_XMLVariant(&local_160);
    ParamHelper(&local_270,(ON_XMLParameters *)local_50,L"diffuse");
    OVar5 = ::ON_XMLVariant::AsColor(&local_270);
    local_174.m_color._8_8_ = OVar5.m_color._8_8_;
    local_2858 = OVar5.m_color[0];
    fStack_2854 = OVar5.m_color[1];
    local_174.m_color[0] = local_2858;
    local_174.m_color[1] = fStack_2854;
    local_164 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                ON_4fColor::operator_cast_to_ON_Color(&local_174);
    (__return_storage_ptr__->m_diffuse).field_0 = local_164;
    ::ON_XMLVariant::~ON_XMLVariant(&local_270);
    ParamHelper(&local_380,(ON_XMLParameters *)local_50,L"emission");
    OVar5 = ::ON_XMLVariant::AsColor(&local_380);
    local_284.m_color._8_8_ = OVar5.m_color._8_8_;
    local_2888 = OVar5.m_color[0];
    fStack_2884 = OVar5.m_color[1];
    local_284.m_color[0] = local_2888;
    local_284.m_color[1] = fStack_2884;
    local_274 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                ON_4fColor::operator_cast_to_ON_Color(&local_284);
    (__return_storage_ptr__->m_emission).field_0 = local_274;
    ::ON_XMLVariant::~ON_XMLVariant(&local_380);
    ParamHelper(&local_490,(ON_XMLParameters *)local_50,L"specular");
    OVar5 = ::ON_XMLVariant::AsColor(&local_490);
    local_394.m_color._8_8_ = OVar5.m_color._8_8_;
    local_394.m_color._0_8_ = OVar5.m_color._0_8_;
    local_384 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                ON_4fColor::operator_cast_to_ON_Color(&local_394);
    (__return_storage_ptr__->m_specular).field_0 = local_384;
    ::ON_XMLVariant::~ON_XMLVariant(&local_490);
    ParamHelper(&local_588,(ON_XMLParameters *)local_50,L"shine");
    dVar1 = ::ON_XMLVariant::AsDouble(&local_588);
    __return_storage_ptr__->m_shine = dVar1 * 255.0;
    ::ON_XMLVariant::~ON_XMLVariant(&local_588);
    ParamHelper(&local_698,(ON_XMLParameters *)local_50,L"reflection");
    OVar5 = ::ON_XMLVariant::AsColor(&local_698);
    local_59c.m_color._8_8_ = OVar5.m_color._8_8_;
    local_28e8 = OVar5.m_color[0];
    fStack_28e4 = OVar5.m_color[1];
    local_59c.m_color[0] = local_28e8;
    local_59c.m_color[1] = fStack_28e4;
    local_58c = (anon_union_4_2_6147a14e_for_ON_Color_15)
                ON_4fColor::operator_cast_to_ON_Color(&local_59c);
    (__return_storage_ptr__->m_reflection).field_0 = local_58c;
    ::ON_XMLVariant::~ON_XMLVariant(&local_698);
    ParamHelper(&local_790,(ON_XMLParameters *)local_50,L"reflectivity");
    dVar1 = ::ON_XMLVariant::AsDouble(&local_790);
    __return_storage_ptr__->m_reflectivity = dVar1;
    ::ON_XMLVariant::~ON_XMLVariant(&local_790);
    ParamHelper(&local_888,(ON_XMLParameters *)local_50,L"transparency");
    dVar1 = ::ON_XMLVariant::AsDouble(&local_888);
    __return_storage_ptr__->m_transparency = dVar1;
    ::ON_XMLVariant::~ON_XMLVariant(&local_888);
    ParamHelper(&local_998,(ON_XMLParameters *)local_50,L"transparent");
    OVar5 = ::ON_XMLVariant::AsColor(&local_998);
    local_89c.m_color._8_8_ = OVar5.m_color._8_8_;
    local_89c.m_color._0_8_ = OVar5.m_color._0_8_;
    local_88c = (anon_union_4_2_6147a14e_for_ON_Color_15)
                ON_4fColor::operator_cast_to_ON_Color(&local_89c);
    (__return_storage_ptr__->m_transparent).field_0 = local_88c;
    ::ON_XMLVariant::~ON_XMLVariant(&local_998);
    ParamHelper(&local_a90,(ON_XMLParameters *)local_50,L"ior");
    dVar1 = ::ON_XMLVariant::AsDouble(&local_a90);
    __return_storage_ptr__->m_index_of_refraction = dVar1;
    ::ON_XMLVariant::~ON_XMLVariant(&local_a90);
    ParamHelper(&local_b88,(ON_XMLParameters *)local_50,L"polish-amount");
    dVar1 = ::ON_XMLVariant::AsDouble(&local_b88);
    __return_storage_ptr__->m_reflection_glossiness = 1.0 - dVar1;
    ::ON_XMLVariant::~ON_XMLVariant(&local_b88);
    ParamHelper(&local_c80,(ON_XMLParameters *)local_50,L"clarity-amount");
    dVar1 = ::ON_XMLVariant::AsDouble(&local_c80);
    __return_storage_ptr__->m_refraction_glossiness = 1.0 - dVar1;
    ::ON_XMLVariant::~ON_XMLVariant(&local_c80);
    ParamHelper(&local_d78,(ON_XMLParameters *)local_50,L"fresnel-enabled");
    bVar2 = ::ON_XMLVariant::AsBool(&local_d78);
    ON_Material::SetFresnelReflections(__return_storage_ptr__,bVar2);
    ::ON_XMLVariant::~ON_XMLVariant(&local_d78);
    ParamHelper(&local_e70,(ON_XMLParameters *)local_50,L"disable-lighting");
    bVar2 = ::ON_XMLVariant::AsBool(&local_e70);
    ON_Material::SetDisableLighting(__return_storage_ptr__,bVar2);
    ::ON_XMLVariant::~ON_XMLVariant(&local_e70);
    __return_storage_ptr__->m_fresnel_index_of_refraction = 1.56;
    ParamHelper((ON_XMLVariant *)
                &pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,(ON_XMLParameters *)local_50,L"is-physically-based");
    bVar2 = ::ON_XMLVariant::AsBool
                      ((ON_XMLVariant *)
                       &pbm.
                        super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    ::ON_XMLVariant::~ON_XMLVariant
              ((ON_XMLVariant *)
               &pbm.super___shared_ptr<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (bVar2) {
      ON_Material::ToPhysicallyBased(__return_storage_ptr__);
      ON_Material::PhysicallyBased((ON_Material *)local_f78);
      s.m_s._4_4_ = 0;
      ParamHelper(&local_1080,(ON_XMLParameters *)local_50,L"pbr-brdf");
      ::ON_XMLVariant::AsString((ON_XMLVariant *)local_f88);
      ::ON_XMLVariant::~ON_XMLVariant(&local_1080);
      bVar2 = ::operator==((ON_wString *)local_f88,L"ward");
      if (bVar2) {
        s.m_s._4_4_ = 1;
      }
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[4])(peVar3,(undefined1 *)((long)&s.m_s + 4));
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1188,(ON_XMLParameters *)local_50,L"pbr-base-color");
      OVar5 = ::ON_XMLVariant::AsColor(&local_1188);
      local_2988 = OVar5.m_color[2];
      fStack_2984 = OVar5.m_color[3];
      local_2978 = OVar5.m_color[0];
      fStack_2974 = OVar5.m_color[1];
      local_1090 = local_2978;
      fStack_108c = fStack_2974;
      local_1088 = local_2988;
      fStack_1084 = fStack_2984;
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[6])(peVar3,&local_1090);
      ::ON_XMLVariant::~ON_XMLVariant(&local_1188);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1280,(ON_XMLParameters *)local_50,L"pbr-subsurface");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1280);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[8])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1280);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1388,(ON_XMLParameters *)local_50,L"pbr-subsurface-scattering-color");
      OVar5 = ::ON_XMLVariant::AsColor(&local_1388);
      local_29c8 = OVar5.m_color[2];
      fStack_29c4 = OVar5.m_color[3];
      local_29b8 = OVar5.m_color[0];
      fStack_29b4 = OVar5.m_color[1];
      local_1290 = local_29b8;
      fStack_128c = fStack_29b4;
      local_1288 = local_29c8;
      fStack_1284 = fStack_29c4;
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[10])(peVar3,&local_1290);
      ::ON_XMLVariant::~ON_XMLVariant(&local_1388);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1480,(ON_XMLParameters *)local_50,L"pbr-subsurface-scattering-radius");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1480);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0xc])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1480);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1578,(ON_XMLParameters *)local_50,L"pbr-specular");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1578);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x10])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1578);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1670,(ON_XMLParameters *)local_50,L"pbr-specular-tint");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1670);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x14])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1670);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1768,(ON_XMLParameters *)local_50,L"pbr-metallic");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1768);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0xe])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1768);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1860,(ON_XMLParameters *)local_50,L"pbr-roughness");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1860);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x16])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1860);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1958,(ON_XMLParameters *)local_50,L"pbr-anisotropic");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1958);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x18])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1958);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1a50,(ON_XMLParameters *)local_50,L"pbr-anisotropic-rotation");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1a50);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x1a])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1a50);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1b48,(ON_XMLParameters *)local_50,L"pbr-sheen");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1b48);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x1c])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1b48);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1c40,(ON_XMLParameters *)local_50,L"pbr-sheen-tint");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1c40);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x1e])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1c40);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1d38,(ON_XMLParameters *)local_50,L"pbr-clearcoat");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1d38);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x20])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1d38);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1e30,(ON_XMLParameters *)local_50,L"pbr-clearcoat-roughness");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1e30);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x22])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1e30);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_1f28,(ON_XMLParameters *)local_50,L"pbr-opacity");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_1f28);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x26])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_1f28);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_2020,(ON_XMLParameters *)local_50,L"pbr-opacity-ior");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_2020);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x24])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_2020);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_2118,(ON_XMLParameters *)local_50,L"pbr-opacity-roughness");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_2118);
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x28])(SUB84(dVar1,0));
      ::ON_XMLVariant::~ON_XMLVariant(&local_2118);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_2220,(ON_XMLParameters *)local_50,L"pbr-emission");
      OVar5 = ::ON_XMLVariant::AsColor(&local_2220);
      local_2120 = OVar5.m_color._8_8_;
      local_2128 = OVar5.m_color._0_8_;
      (*peVar3->_vptr_ON_PhysicallyBasedMaterial[0x2a])(OVar5.m_color[0],OVar5.m_color[2]);
      ::ON_XMLVariant::~ON_XMLVariant(&local_2220);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_2318,(ON_XMLParameters *)local_50,L"pbr-alpha");
      dVar1 = ::ON_XMLVariant::AsDouble(&local_2318);
      ON_PhysicallyBasedMaterial::SetAlpha(peVar3,dVar1);
      ::ON_XMLVariant::~ON_XMLVariant(&local_2318);
      peVar3 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f78);
      ParamHelper(&local_2410,(ON_XMLParameters *)local_50,L"pbr-use-base-color-texture-alpha");
      bVar2 = ::ON_XMLVariant::AsBool(&local_2410);
      ON_PhysicallyBasedMaterial::SetUseBaseColorTextureAlphaForObjectAlphaTransparencyTexture
                (peVar3,bVar2);
      ::ON_XMLVariant::~ON_XMLVariant(&local_2410);
      ON_wString::~ON_wString((ON_wString *)local_f88);
      std::shared_ptr<ON_PhysicallyBasedMaterial>::~shared_ptr
                ((shared_ptr<ON_PhysicallyBasedMaterial> *)local_f78);
    }
    ON_ModelComponent::Name((ON_ModelComponent *)local_2418);
    pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_2418);
    ON_ModelComponent::SetName(&__return_storage_ptr__->super_ON_ModelComponent,pwVar4);
    ON_wString::~ON_wString((ON_wString *)local_2418);
    ON_ClassArray<ON_Texture>::Destroy
              (&(__return_storage_ptr__->m_textures).super_ON_ClassArray<ON_Texture>);
    tex._508_4_ = 1;
    do {
      ON_Texture::ON_Texture((ON_Texture *)(v._PRIVATE + 0xe0));
      ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)&s_1);
      ON_wString::ON_wString(&local_2720);
      ON_wString::Format(&local_2720,L"Texture-%u-",(ulong)(uint)tex._508_4_);
      ON_wString::operator+((ON_wString *)(local_2738 + 0x10),(wchar_t *)&local_2720);
      pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_2738 + 0x10));
      bVar2 = ON_XMLParameters::GetParam((ON_XMLParameters *)local_50,pwVar4,(ON_XMLVariant *)&s_1);
      ON_wString::~ON_wString((ON_wString *)(local_2738 + 0x10));
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        ::ON_XMLVariant::AsString((ON_XMLVariant *)local_2738);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_2738);
        ON_FileReference::SetFullPath((ON_FileReference *)&tex.m_mapping_channel_id,pwVar4,false);
        ON_wString::~ON_wString((ON_wString *)local_2738);
        ON_wString::operator+(&local_2740,(wchar_t *)&local_2720);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_2740);
        bVar2 = ON_XMLParameters::GetParam
                          ((ON_XMLParameters *)local_50,pwVar4,(ON_XMLVariant *)&s_1);
        ON_wString::~ON_wString(&local_2740);
        if (bVar2) {
          tex.m_image_file_reference.m_full_path_hash.m_digest[0x10] =
               ::ON_XMLVariant::operator_cast_to_bool((ON_XMLVariant *)&s_1);
        }
        ON_wString::operator+(&local_2748,(wchar_t *)&local_2720);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_2748);
        bVar2 = ON_XMLParameters::GetParam
                          ((ON_XMLParameters *)local_50,pwVar4,(ON_XMLVariant *)&s_1);
        ON_wString::~ON_wString(&local_2748);
        if (bVar2) {
          tex.m_bump_scale.m_t[1] = ::ON_XMLVariant::operator_cast_to_double((ON_XMLVariant *)&s_1);
        }
        ON_wString::operator+(&local_2750,(wchar_t *)&local_2720);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_2750);
        bVar2 = ON_XMLParameters::GetParam
                          ((ON_XMLParameters *)local_50,pwVar4,(ON_XMLVariant *)&s_1);
        ON_wString::~ON_wString(&local_2750);
        if (bVar2) {
          tex.m_image_file_reference.m_full_path_status =
               ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&s_1);
        }
        ON_wString::operator+(&local_2758,(wchar_t *)&local_2720);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_2758);
        bVar2 = ON_XMLParameters::GetParam
                          ((ON_XMLParameters *)local_50,pwVar4,(ON_XMLVariant *)&s_1);
        ON_wString::~ON_wString(&local_2758);
        if (bVar2) {
          tex.m_type = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&s_1);
          tex.m_mode = tex.m_type;
        }
        ON_wString::operator+(&local_2760,(wchar_t *)&local_2720);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_2760);
        bVar2 = ON_XMLParameters::GetParam
                          ((ON_XMLParameters *)local_50,pwVar4,(ON_XMLVariant *)&s_1);
        ON_wString::~ON_wString(&local_2760);
        if (bVar2) {
          tex._224_4_ = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&s_1);
        }
        ON_wString::operator+(&local_2768,(wchar_t *)&local_2720);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_2768);
        bVar2 = ON_XMLParameters::GetParam
                          ((ON_XMLParameters *)local_50,pwVar4,(ON_XMLVariant *)&s_1);
        ON_wString::~ON_wString(&local_2768);
        if (bVar2) {
          ::ON_XMLVariant::AsXform(&local_27e8,(ON_XMLVariant *)&s_1);
          memcpy(&tex.m_wrapv,&local_27e8,0x80);
        }
        ON_wString::operator+(&local_27f0,(wchar_t *)&local_2720);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_27f0);
        bVar2 = ON_XMLParameters::GetParam
                          ((ON_XMLParameters *)local_50,pwVar4,(ON_XMLVariant *)&s_1);
        ON_wString::~ON_wString(&local_27f0);
        if (bVar2) {
          tex.m_minfilter = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&s_1);
        }
        ON_wString::operator+(&local_27f8,(wchar_t *)&local_2720);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_27f8);
        bVar2 = ON_XMLParameters::GetParam
                          ((ON_XMLParameters *)local_50,pwVar4,(ON_XMLVariant *)&s_1);
        ON_wString::~ON_wString(&local_27f8);
        if (bVar2) {
          tex.m_magfilter = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)&s_1);
        }
        ON_ClassArray<ON_Texture>::Append
                  (&(__return_storage_ptr__->m_textures).super_ON_ClassArray<ON_Texture>,
                   (ON_Texture *)(v._PRIVATE + 0xe0));
        tex._508_4_ = tex._508_4_ + 1;
        local_2738._12_4_ = 0;
      }
      else {
        local_2738._12_4_ = 3;
      }
      ON_wString::~ON_wString(&local_2720);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&s_1);
      ON_Texture::~ON_Texture((ON_Texture *)(v._PRIVATE + 0xe0));
    } while (local_2738._12_4_ == 0);
    ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)local_50);
  }
  local_2738._12_4_ = 1;
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

ON_Material ON_RenderMaterial::ToOnMaterial(void) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_Material mat;

  const ON_XMLNode* sim_node = _private->XMLNode_Simulation();
  if (nullptr != sim_node)
  {
    ON_XMLParameters p(*sim_node);

    mat.m_ambient               =       ParamHelper(p, ON_MATERIAL_AMBIENT              ).AsColor();
    mat.m_diffuse               =       ParamHelper(p, ON_MATERIAL_DIFFUSE              ).AsColor();
    mat.m_emission              =       ParamHelper(p, ON_MATERIAL_EMISSION             ).AsColor();
    mat.m_specular              =       ParamHelper(p, ON_MATERIAL_SPECULAR             ).AsColor();
    mat.m_shine                 =       ParamHelper(p, ON_MATERIAL_SHINE                ).AsDouble() * ON_Material::MaxShine;
    mat.m_reflection            =       ParamHelper(p, ON_MATERIAL_SIM_REFLECTION_COLOR ).AsColor();
    mat.m_reflectivity          =       ParamHelper(p, ON_MATERIAL_REFLECTIVITY_AMOUNT  ).AsDouble();
    mat.m_transparency          =       ParamHelper(p, ON_MATERIAL_TRANSPARENCY_AMOUNT  ).AsDouble();
    mat.m_transparent           =       ParamHelper(p, ON_MATERIAL_SIM_TRANSPARENT_COLOR).AsColor();
    mat.m_index_of_refraction   =       ParamHelper(p, ON_MATERIAL_IOR                  ).AsDouble();
    mat.m_reflection_glossiness = 1.0 - ParamHelper(p, ON_MATERIAL_POLISH_AMOUNT        ).AsDouble();
    mat.m_refraction_glossiness = 1.0 - ParamHelper(p, ON_MATERIAL_CLARITY_AMOUNT       ).AsDouble();
    mat.SetFresnelReflections   (       ParamHelper(p, ON_MATERIAL_FRESNEL_ENABLED      ).AsBool());
    mat.SetDisableLighting      (       ParamHelper(p, ON_MATERIAL_DISABLE_LIGHTING     ).AsBool());

    mat.m_fresnel_index_of_refraction = 1.56;

    if (ParamHelper(p, ON_MATERIAL_IS_PHYSICALLY_BASED).AsBool())
    {
      mat.ToPhysicallyBased();

      auto pbm = mat.PhysicallyBased();

      auto brdf = ON_PhysicallyBasedMaterial::BRDFs::GGX;
      const ON_wString s = ParamHelper(p, ON_PBR_MATERIAL_BRDF).AsString();
      if (s == ON_PBR_MATERIAL_BRDF_WARD)
        brdf = ON_PhysicallyBasedMaterial::BRDFs::Ward;
      pbm->SetBRDF(brdf);

      pbm->SetBaseColor                 (ParamHelper(p, ON_PBR_MATERIAL_BASE_COLOR).AsColor());
      pbm->SetSubsurface                (ParamHelper(p, ON_PBR_MATERIAL_SUBSURFACE).AsDouble());
      pbm->SetSubsurfaceScatteringColor (ParamHelper(p, ON_PBR_MATERIAL_SUBSURFACE_SCATTERING_COLOR).AsColor());
      pbm->SetSubsurfaceScatteringRadius(ParamHelper(p, ON_PBR_MATERIAL_SUBSURFACE_SCATTERING_RADIUS).AsDouble());
      pbm->SetSpecular                  (ParamHelper(p, ON_PBR_MATERIAL_SPECULAR).AsDouble());
      pbm->SetSpecularTint              (ParamHelper(p, ON_PBR_MATERIAL_SPECULAR_TINT).AsDouble());
      pbm->SetMetallic                  (ParamHelper(p, ON_PBR_MATERIAL_METALLIC).AsDouble());
      pbm->SetRoughness                 (ParamHelper(p, ON_PBR_MATERIAL_ROUGHNESS).AsDouble());
      pbm->SetAnisotropic               (ParamHelper(p, ON_PBR_MATERIAL_ANISOTROPIC).AsDouble());
      pbm->SetAnisotropicRotation       (ParamHelper(p, ON_PBR_MATERIAL_ANISOTROPIC_ROTATION).AsDouble());
      pbm->SetSheen                     (ParamHelper(p, ON_PBR_MATERIAL_SHEEN).AsDouble());
      pbm->SetSheenTint                 (ParamHelper(p, ON_PBR_MATERIAL_SHEEN_TINT).AsDouble());
      pbm->SetClearcoat                 (ParamHelper(p, ON_PBR_MATERIAL_CLEARCOAT).AsDouble());
      pbm->SetClearcoatRoughness        (ParamHelper(p, ON_PBR_MATERIAL_CLEARCOAT_ROUGHNESS).AsDouble());
      pbm->SetOpacity                   (ParamHelper(p, ON_PBR_MATERIAL_OPACITY).AsDouble());
      pbm->SetOpacityIOR                (ParamHelper(p, ON_PBR_MATERIAL_OPACITY_IOR).AsDouble());
      pbm->SetOpacityRoughness          (ParamHelper(p, ON_PBR_MATERIAL_OPACITY_ROUGHNESS).AsDouble());
      pbm->SetEmission                  (ParamHelper(p, ON_PBR_MATERIAL_EMISSION_COLOR).AsColor());
      pbm->SetAlpha                     (ParamHelper(p, ON_PBR_MATERIAL_ALPHA).AsDouble());
      pbm->SetUseBaseColorTextureAlphaForObjectAlphaTransparencyTexture(ParamHelper(p, ON_PBR_MATERIAL_USE_BASE_COLOR_TEXTURE_ALPHA).AsBool());
    }

    mat.SetName(Name());

    mat.m_textures.Destroy();

    // Iterate over the children.
    int count = 1;
    while (true)
    {
      ON_Texture tex;
      ON_XMLVariant v;

      ON_wString s;
      s.Format(ON_RENDER_MATERIAL_TEXTURE_SIMULATION_FORMAT, count);

      if (!p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_FILENAME, v))
        break; // Not ideal.

      tex.m_image_file_reference.SetFullPath(v.AsString(), false);

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_ON, v))
        tex.m_bOn = v;

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_AMOUNT, v))
        tex.m_blend_constant_A = v;

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_TYPE, v))
        tex.m_type = ON_Texture::TYPE(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_FILTER, v))
        tex.m_minfilter = tex.m_magfilter = ON_Texture::FILTER(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_MODE, v))
        tex.m_mode = ON_Texture::MODE(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_UVW, v))
        tex.m_uvw = v.AsXform();

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_WRAP_U, v))
        tex.m_wrapu = ON_Texture::WRAP(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_WRAP_V, v))
        tex.m_wrapv = ON_Texture::WRAP(v.AsInteger());

      mat.m_textures.Append(tex);
      count++;
    }
  }

  return mat;
}